

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

char * __thiscall
bloaty::CustomDataSource::_InternalParse(CustomDataSource *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  string *psVar3;
  Rep *pRVar4;
  bool bVar5;
  byte *pbVar6;
  Regex *msg;
  int iVar7;
  char *field_name;
  char cVar8;
  uint32 uVar9;
  char *pcVar10;
  internal *this_00;
  pair<const_char_*,_unsigned_int> pVar11;
  StringPiece str;
  byte *local_58;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  InternalMetadataWithArena *local_40;
  RepeatedPtrFieldBase *local_38;
  char *size;
  
  local_38 = &(this->rewrite_).super_RepeatedPtrFieldBase;
  local_48 = &this->base_data_source_;
  local_50 = &this->name_;
  local_40 = &this->_internal_metadata_;
  local_58 = (byte *)ptr;
  do {
    bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
    if (bVar5) {
      return (char *)local_58;
    }
    bVar1 = *local_58;
    pVar11.second._0_1_ = bVar1;
    pVar11.first = (char *)(local_58 + 1);
    pVar11._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_58[1];
      uVar9 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = google::protobuf::internal::ReadTagFallback((char *)local_58,uVar9);
      }
      else {
        pVar11.second = uVar9;
        pVar11.first = (char *)(local_58 + 2);
        pVar11._12_4_ = 0;
      }
    }
    local_58 = (byte *)pVar11.first;
    if (local_58 == (byte *)0x0) {
LAB_0018f296:
      cVar8 = '\x04';
    }
    else {
      uVar9 = pVar11.second;
      field_name = (char *)(pVar11._8_8_ >> 3 & 0x1fffffff);
      iVar7 = (int)field_name;
      cVar8 = (char)pVar11.second;
      if (iVar7 == 3) {
        if (cVar8 != '\x1a') goto LAB_0018f244;
        local_58 = local_58 + -1;
        do {
          local_58 = local_58 + 1;
          pRVar4 = (this->rewrite_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_0018f1c8:
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (local_38,(this->rewrite_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0018f1d8:
            pRVar4 = (this->rewrite_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = google::protobuf::Arena::CreateMaybeMessage<bloaty::Regex>
                            ((this->rewrite_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->rewrite_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = (this->rewrite_).super_RepeatedPtrFieldBase.current_size_;
            (this->rewrite_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            pRVar4->elements[iVar7] = msg;
          }
          else {
            iVar7 = (this->rewrite_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar7) {
              if (pRVar4->allocated_size == (this->rewrite_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0018f1c8;
              goto LAB_0018f1d8;
            }
            (this->rewrite_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            msg = (Regex *)pRVar4->elements[iVar7];
          }
          local_58 = (byte *)google::protobuf::internal::ParseContext::ParseMessage<bloaty::Regex>
                                       (ctx,msg,(char *)local_58);
          if (local_58 == (byte *)0x0) goto LAB_0018f296;
          cVar8 = '\x02';
        } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_58 == 0x1a));
      }
      else {
        if (iVar7 == 2) {
          if (cVar8 != '\x12') goto LAB_0018f244;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          if ((this->base_data_source_).ptr_ ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (local_48,(string *)
                                &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          }
          psVar3 = local_48->ptr_;
          pbVar6 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (psVar3,(char *)local_58,ctx);
          this_00 = (internal *)(psVar3->_M_dataplus)._M_p;
          size = (char *)psVar3->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"size_t to int conversion");
          }
          pcVar10 = "bloaty.CustomDataSource.base_data_source";
        }
        else {
          if ((iVar7 != 1) || (cVar8 != '\n')) {
LAB_0018f244:
            if (uVar9 == 0 || (uVar9 & 7) == 4) {
              (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
              cVar8 = '\t';
            }
            else {
              local_58 = (byte *)google::protobuf::internal::UnknownFieldParse
                                           (uVar9,local_40,(char *)local_58,ctx);
              cVar8 = (local_58 == (byte *)0x0) * '\x02' + '\x02';
            }
            goto LAB_0018f28b;
          }
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          if ((this->name_).ptr_ ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (local_50,(string *)
                                &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          }
          psVar3 = local_50->ptr_;
          pbVar6 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (psVar3,(char *)local_58,ctx);
          this_00 = (internal *)(psVar3->_M_dataplus)._M_p;
          size = (char *)psVar3->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"size_t to int conversion");
          }
          pcVar10 = "bloaty.CustomDataSource.name";
        }
        str.length_ = (stringpiece_ssize_type)pcVar10;
        str.ptr_ = size;
        google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
        cVar8 = (pbVar6 == (byte *)0x0) * '\x02' + '\x02';
        local_58 = pbVar6;
      }
    }
LAB_0018f28b:
    if (cVar8 != '\x02') {
      if (cVar8 == '\x04') {
        local_58 = (byte *)0x0;
      }
      return (char *)local_58;
    }
  } while( true );
}

Assistant:

const char* CustomDataSource::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "bloaty.CustomDataSource.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string base_data_source = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_base_data_source(), ptr, ctx, "bloaty.CustomDataSource.base_data_source");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.Regex rewrite = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_rewrite(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}